

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O0

bool __thiscall
iDynTree::BerdyHelper::computeBerdySensorMatrices
          (BerdyHelper *this,SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *Y,VectorDynSize *bY)

{
  IndexRange startingColumn;
  IndexRange startingRow;
  IndexRange range;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  size_type sVar6;
  SpatialAcc *pSVar7;
  BerdyHelper *pBVar8;
  ulong uVar9;
  Transform *pTVar10;
  ulong in_RDX;
  Triplets *in_RSI;
  long in_RDI;
  undefined1 auVar11 [16];
  IndexRange IVar12;
  Transform base_X_link;
  IndexRange netExternalWrenchVariableIndexRange;
  LinkIndex idx_3;
  IndexRange rcmRange;
  IndexRange jointWrenchOffset;
  IndexRange sensorRange_3;
  size_t i;
  Transform measurementFrame_X_link;
  IndexRange netExtWrenchRange;
  IndexRange sensorRange_2;
  Wrench baseLinkNetTotalWrenchesWithoutGrav;
  Transform measurementFrame_X_child;
  Transform *base_X_child;
  IJointConstPtr neighborJoint;
  LinkIndex childIndex;
  LinkIndex neighborIndex;
  uint neigh_i;
  LinkIndex idx_2;
  Matrix1x6 SdynTree;
  SpatialMotionVector S;
  size_t localDof;
  size_t dofOffset;
  size_t jointDOFs;
  LinkIndex parentLinkIdx;
  LinkIndex visitedLinkIdx;
  IJointConstPtr toParentJoint;
  LinkConstPtr parentLink;
  LinkConstPtr visitedLink;
  TraversalIndex traversalEl;
  IndexRange jointTrqRange;
  IndexRange sensorRange_1;
  DOFIndex idx_1;
  IndexRange jointAccRange;
  IndexRange sensorRange;
  DOFIndex idx;
  undefined4 in_stack_fffffffffffff6d8;
  BerdySensorTypes in_stack_fffffffffffff6dc;
  BerdyHelper *in_stack_fffffffffffff6e0;
  undefined4 in_stack_fffffffffffff6e8;
  BerdySensorTypes in_stack_fffffffffffff6ec;
  BerdyHelper *in_stack_fffffffffffff6f0;
  undefined4 in_stack_fffffffffffff6f8;
  undefined4 uVar13;
  BerdyDynamicVariablesTypes in_stack_fffffffffffff6fc;
  BerdyDynamicVariablesTypes dynamicVariableType;
  BerdyHelper *in_stack_fffffffffffff700;
  BerdyHelper *this_00;
  long in_stack_fffffffffffff708;
  BerdyHelper *in_stack_fffffffffffff710;
  MatrixFixSize<6U,_6U> *in_stack_fffffffffffff718;
  ulong in_stack_fffffffffffff720;
  size_t in_stack_fffffffffffff728;
  Triplets *in_stack_fffffffffffff730;
  SpatialInertia *this_01;
  VectorDynSize *in_stack_fffffffffffff740;
  ptrdiff_t in_stack_fffffffffffff748;
  ptrdiff_t in_stack_fffffffffffff750;
  SpatialForceVector *in_stack_fffffffffffff768;
  Transform local_738 [96];
  IndexRange local_6d8;
  long local_6c8;
  IndexRange local_6c0;
  ptrdiff_t local_6b0;
  ptrdiff_t local_6a8;
  ptrdiff_t local_6a0;
  ptrdiff_t local_698;
  IndexRange local_690;
  IndexRange local_680;
  BerdyHelper *local_670;
  IndexRange local_4e8;
  IndexRange local_4d8;
  IndexRange local_498;
  SpatialInertia local_478 [56];
  Wrench local_440 [6];
  IndexRange local_2e8;
  IndexRange local_2d8;
  Transform local_2c8 [96];
  Transform local_268 [96];
  undefined8 local_208;
  undefined1 local_200 [16];
  long *local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  uint local_1c4;
  size_type local_1c0;
  IndexRange local_1b8;
  IndexRange local_1a8;
  non_const_type local_150;
  MatrixFixSize<1U,_6U> local_148;
  undefined1 local_118 [48];
  ulong local_e8;
  undefined8 local_e0;
  ulong local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  long *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  long local_a8;
  Triplet local_a0 [24];
  IndexRange local_88;
  IndexRange local_78;
  long local_68;
  Triplet local_60 [24];
  IndexRange local_48;
  IndexRange local_38;
  long local_28;
  ulong local_20;
  Triplets *local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::resize
            ((ulong)in_RSI,*(ulong *)(in_RDI + 0x208));
  iDynTree::VectorDynSize::resize(local_20);
  iDynTree::Triplets::clear();
  iDynTree::VectorDynSize::zero();
  if ((*(int *)(in_RDI + 0x1b0) == 2) ||
     (bVar1 = computeBerdySensorsMatricesFromModel
                        ((BerdyHelper *)baseLinkNetTotalWrenchesWithoutGrav._40_8_,
                         (SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *)
                         baseLinkNetTotalWrenchesWithoutGrav._32_8_,
                         (VectorDynSize *)baseLinkNetTotalWrenchesWithoutGrav._24_8_), bVar1)) {
    if ((*(byte *)(in_RDI + 0x1b5) & 1) != 0) {
      for (local_28 = 0; lVar5 = local_28, lVar4 = iDynTree::Model::getNrOfDOFs(), lVar5 < lVar4;
          local_28 = local_28 + 1) {
        local_38 = getRangeDOFSensorVariable
                             (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
                              (DOFIndex)in_stack_fffffffffffff6e0);
        local_48 = getRangeDOFVariable(in_stack_fffffffffffff710,
                                       (BerdyDynamicVariablesTypes)
                                       ((ulong)in_stack_fffffffffffff708 >> 0x20),
                                       (DOFIndex)in_stack_fffffffffffff700);
        iDynTree::Triplet::Triplet(local_60,local_38.offset,local_48.offset,1.0);
        iDynTree::Triplets::pushTriplet((Triplet *)(in_RDI + 0x370));
      }
    }
    if ((*(byte *)(in_RDI + 0x1b6) & 1) != 0) {
      if (*(int *)(in_RDI + 0x1b0) == 0) {
        for (local_68 = 0; lVar5 = local_68, lVar4 = iDynTree::Model::getNrOfDOFs(), lVar5 < lVar4;
            local_68 = local_68 + 1) {
          local_78 = getRangeDOFSensorVariable
                               (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
                                (DOFIndex)in_stack_fffffffffffff6e0);
          local_88 = getRangeDOFVariable(in_stack_fffffffffffff710,
                                         (BerdyDynamicVariablesTypes)
                                         ((ulong)in_stack_fffffffffffff708 >> 0x20),
                                         (DOFIndex)in_stack_fffffffffffff700);
          iDynTree::Triplet::Triplet(local_a0,local_78.offset,local_88.offset,1.0);
          iDynTree::Triplets::pushTriplet((Triplet *)(in_RDI + 0x370));
        }
      }
      else {
        for (local_a8 = 1; lVar5 = local_a8, uVar2 = iDynTree::Traversal::getNrOfVisitedLinks(),
            lVar5 < (long)(ulong)uVar2; local_a8 = local_a8 + 1) {
          local_b0 = iDynTree::Traversal::getLink(in_RDI + 0x130);
          local_b8 = iDynTree::Traversal::getParentLink(in_RDI + 0x130);
          local_c0 = (long *)iDynTree::Traversal::getParentJoint(in_RDI + 0x130);
          local_c8 = iDynTree::Link::getIndex();
          local_d0 = iDynTree::Link::getIndex();
          uVar2 = (**(code **)(*local_c0 + 0x20))();
          local_d8 = (ulong)uVar2;
          local_e0 = (**(code **)(*local_c0 + 0xc0))();
          for (local_e8 = 0; local_e8 < local_d8; local_e8 = local_e8 + 1) {
            (**(code **)(*local_c0 + 0x60))
                      (local_118,local_c0,local_e8 & 0xffffffff,local_c8,local_d0);
            MatrixFixSize<1U,_6U>::MatrixFixSize(&local_148);
            toEigen((SpatialMotionVector *)in_stack_fffffffffffff768);
            local_150 = (non_const_type)
                        Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::transpose
                                  ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                                   CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
            toEigen<6U>((MatrixFixSize<1U,_6U> *)
                        CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
            Eigen::Map<Eigen::Matrix<double,1,6,1,1,6>,0,Eigen::Stride<0,0>>::operator=
                      ((Map<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_0,_Eigen::Stride<0,_0>_> *)
                       in_stack_fffffffffffff6e0,
                       (DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_> *)
                       CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
            in_stack_fffffffffffff768 = (SpatialForceVector *)(in_RDI + 0x370);
            local_1a8 = getRangeDOFSensorVariable
                                  (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
                                   (DOFIndex)in_stack_fffffffffffff6e0);
            (**(code **)(*local_c0 + 0xa0))();
            local_1b8 = getRangeJointVariable
                                  (in_stack_fffffffffffff710,
                                   (BerdyDynamicVariablesTypes)
                                   ((ulong)in_stack_fffffffffffff708 >> 0x20),
                                   (JointIndex)in_stack_fffffffffffff700);
            Triplets::addSubMatrix<1u,6u>
                      (in_stack_fffffffffffff730,in_stack_fffffffffffff728,in_stack_fffffffffffff720
                       ,(MatrixFixSize<1U,_6U> *)in_stack_fffffffffffff718);
          }
        }
      }
    }
    IVar12.size = in_stack_fffffffffffff728;
    IVar12.offset = (ptrdiff_t)in_stack_fffffffffffff730;
    if ((*(byte *)(in_RDI + 0x1b7) & 1) != 0) {
      local_1c0 = 0;
      while( true ) {
        sVar6 = local_1c0;
        lVar5 = iDynTree::Model::getNrOfLinks();
        if (lVar5 <= (long)sVar6) break;
        if (*(int *)(in_RDI + 0x1b0) == 0) {
          iDynTree::Traversal::getBaseLink();
          sVar6 = iDynTree::Link::getIndex();
          if (sVar6 != local_1c0) goto LAB_0052522e;
          if ((*(byte *)(in_RDI + 0x1b8) & 1) != 0) {
            local_1c4 = 0;
            while( true ) {
              uVar2 = local_1c4;
              uVar3 = iDynTree::Model::getNrOfNeighbors(in_RDI);
              if (uVar3 <= uVar2) break;
              auVar11 = iDynTree::Model::getNeighbor(in_RDI,(uint)local_1c0);
              local_1d8 = auVar11._8_8_;
              local_1e8 = auVar11._0_8_;
              local_1e0 = local_1e8;
              local_1d0 = local_1e8;
              auVar11 = iDynTree::Model::getNeighbor(in_RDI,(uint)local_1c0);
              local_200 = auVar11;
              local_1f0 = (long *)iDynTree::Model::getJoint(in_RDI);
              local_208 = (**(code **)(*local_1f0 + 0x50))
                                    (local_1f0,in_RDI + 0x210,local_1c0,local_1e8);
              std::vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>::operator[]
                        ((vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *)
                         (in_RDI + 0x388),local_1c0);
              iDynTree::Transform::inverse();
              iDynTree::Transform::operator*(local_268,local_2c8);
              in_stack_fffffffffffff740 = (VectorDynSize *)(in_RDI + 0x370);
              local_2d8 = getRangeLinkSensorVariable
                                    (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
                                     (LinkIndex)in_stack_fffffffffffff6e0);
              in_stack_fffffffffffff748 = local_2d8.offset;
              (**(code **)(*local_1f0 + 0xa0))();
              local_2e8 = getRangeJointVariable
                                    (in_stack_fffffffffffff710,
                                     (BerdyDynamicVariablesTypes)
                                     ((ulong)in_stack_fffffffffffff708 >> 0x20),
                                     (JointIndex)in_stack_fffffffffffff700);
              in_stack_fffffffffffff750 = local_2e8.offset;
              iDynTree::Transform::asAdjointTransformWrench();
              Triplets::addSubMatrix<6u,6u>
                        ((Triplets *)IVar12.offset,IVar12.size,in_stack_fffffffffffff720,
                         in_stack_fffffffffffff718);
              local_1c4 = local_1c4 + 1;
            }
            iDynTree::Model::getLink(in_RDI);
            pSVar7 = (SpatialAcc *)iDynTree::Link::getInertia();
            this_01 = local_478;
            iDynTree::SpatialInertia::operator*(this_01,pSVar7);
            iDynTree::Wrench::operator-(local_440);
            Wrench::~Wrench((Wrench *)0x525146);
            in_stack_fffffffffffff720 = local_20;
            IVar12 = getRangeLinkSensorVariable
                               (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
                                (LinkIndex)in_stack_fffffffffffff6e0);
            local_498 = IVar12;
            toEigen(in_stack_fffffffffffff768);
            range.size = in_stack_fffffffffffff750;
            range.offset = in_stack_fffffffffffff748;
            setSubVector<Eigen::Matrix<double,6,1,0,6,1>>
                      (in_stack_fffffffffffff740,range,(Matrix<double,_6,_1,_0,_6,_1> *)this_01);
            Wrench::~Wrench((Wrench *)0x5251db);
          }
        }
        else {
LAB_0052522e:
          local_4d8 = getRangeLinkSensorVariable
                                (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
                                 (LinkIndex)in_stack_fffffffffffff6e0);
          local_4e8 = getRangeLinkVariable
                                (in_stack_fffffffffffff700,in_stack_fffffffffffff6fc,
                                 (LinkIndex)in_stack_fffffffffffff6f0);
          std::vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>::operator[]
                    ((vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *)
                     (in_RDI + 0x388),local_1c0);
          iDynTree::Transform::inverse();
          in_stack_fffffffffffff708 = in_RDI + 0x370;
          in_stack_fffffffffffff710 = (BerdyHelper *)local_4d8.offset;
          in_stack_fffffffffffff718 = (MatrixFixSize<6U,_6U> *)local_4e8.offset;
          iDynTree::Transform::asAdjointTransformWrench();
          Triplets::addSubMatrix<6u,6u>
                    ((Triplets *)IVar12.offset,IVar12.size,in_stack_fffffffffffff720,
                     in_stack_fffffffffffff718);
        }
        local_1c0 = local_1c0 + 1;
      }
    }
    local_670 = (BerdyHelper *)0x0;
    while( true ) {
      this_00 = local_670;
      pBVar8 = (BerdyHelper *)
               std::vector<long,_std::allocator<long>_>::size
                         ((vector<long,_std::allocator<long>_> *)(in_RDI + 0x308));
      if (pBVar8 <= this_00) break;
      std::vector<long,_std::allocator<long>_>::operator[]
                ((vector<long,_std::allocator<long>_> *)(in_RDI + 0x308),(size_type)local_670);
      local_680 = getRangeJointSensorVariable
                            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
                             (JointIndex)in_stack_fffffffffffff6e0);
      std::vector<long,_std::allocator<long>_>::operator[]
                ((vector<long,_std::allocator<long>_> *)(in_RDI + 0x308),(size_type)local_670);
      local_690 = getRangeJointVariable
                            (in_stack_fffffffffffff710,
                             (BerdyDynamicVariablesTypes)((ulong)in_stack_fffffffffffff708 >> 0x20),
                             (JointIndex)this_00);
      local_6a0 = local_680.offset;
      local_698 = local_680.size;
      local_6b0 = local_690.offset;
      local_6a8 = local_690.size;
      startingRow.offset._4_4_ = in_stack_fffffffffffff6fc;
      startingRow.offset._0_4_ = in_stack_fffffffffffff6f8;
      startingRow.size = (ptrdiff_t)this_00;
      startingColumn.offset._4_4_ = in_stack_fffffffffffff6ec;
      startingColumn.offset._0_4_ = in_stack_fffffffffffff6e8;
      startingColumn.size = (ptrdiff_t)in_stack_fffffffffffff6f0;
      Triplets::addDiagonalMatrix
                ((Triplets *)in_stack_fffffffffffff6e0,startingRow,startingColumn,
                 (double)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
      local_670 = (BerdyHelper *)&local_670->field_0x1;
    }
    if (*(int *)(in_RDI + 0x1b0) == 2) {
      local_6c0 = getRangeRCMSensorVariable(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6dc);
      local_6c8 = 0;
      while( true ) {
        uVar13 = (undefined4)local_6c8;
        dynamicVariableType = (BerdyDynamicVariablesTypes)((ulong)local_6c8 >> 0x20);
        uVar9 = iDynTree::Model::getNrOfLinks();
        if (uVar9 <= CONCAT44(dynamicVariableType,uVar13)) break;
        local_6d8 = getRangeLinkVariable
                              (this_00,dynamicVariableType,(LinkIndex)in_stack_fffffffffffff6f0);
        pTVar10 = (Transform *)
                  iDynTree::LinkPositions::operator()((LinkPositions *)(in_RDI + 0x3a0),local_6c8);
        iDynTree::Transform::Transform(local_738,pTVar10);
        in_stack_fffffffffffff6f0 = (BerdyHelper *)local_6d8.offset;
        iDynTree::Transform::asAdjointTransformWrench();
        Triplets::addSubMatrix<6u,6u>
                  ((Triplets *)IVar12.offset,IVar12.size,in_stack_fffffffffffff720,
                   in_stack_fffffffffffff718);
        local_6c8 = local_6c8 + 1;
      }
    }
    iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::setFromTriplets(local_18);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool BerdyHelper::computeBerdySensorMatrices(SparseMatrix<iDynTree::ColumnMajor>& Y, VectorDynSize& bY)
{
    Y.resize(m_nrOfSensorsMeasurements,m_nrOfDynamicalVariables);
    bY.resize(m_nrOfSensorsMeasurements);
    // \todo TODO check if this is a bottleneck
//    Y.zero();
    matrixYElements.clear();
    bY.zero();

    // For now handle all sensor types explicitly TODO clean this up
    
    if(m_options.berdyVariant!=BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES)
    {
        if(!computeBerdySensorsMatricesFromModel(Y, bY))
        {
            return false;
        }
    }
    
    ////////////////////////////////////////////////////////////////////////
    ///// JOINT ACCELERATIONS
    ////////////////////////////////////////////////////////////////////////
    if( m_options.includeAllJointAccelerationsAsSensors )
    {
        for(DOFIndex idx = 0; idx< static_cast<DOFIndex>(m_model.getNrOfDOFs()); idx++)
        {
            // Y for the joint accelerations is just a rows of 0s and one 1  corresponding to the location
            // of the relative joint acceleration in the dynamic variables vector
            IndexRange sensorRange = this->getRangeDOFSensorVariable(DOF_ACCELERATION_SENSOR,idx);
            IndexRange jointAccRange = this->getRangeDOFVariable(DOF_ACCELERATION,idx);

            matrixYElements.pushTriplet(Triplet(sensorRange.offset, jointAccRange.offset, 1));

            // bY for the joint acceleration is zero
        }
    }

    ////////////////////////////////////////////////////////////////////////
    ///// JOINT TORQUES
    ////////////////////////////////////////////////////////////////////////
    if( m_options.includeAllJointTorquesAsSensors )
    {
        if (m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE)
        {
          for(DOFIndex idx = 0; idx < static_cast<DOFIndex>(m_model.getNrOfDOFs()); idx++)
          {
              // Y for the joint torques is just a rows of 0s and one 1  corresponding to the location
            // of the relative joint torques in the dynamic variables vector
            IndexRange sensorRange = this->getRangeDOFSensorVariable(DOF_TORQUE_SENSOR,idx);
            IndexRange jointTrqRange = this->getRangeDOFVariable(DOF_TORQUE,idx);

            matrixYElements.pushTriplet(Triplet(sensorRange.offset, jointTrqRange.offset, 1));

            // bY for the joint torques is zero
          }
        }
        else 
        {
            assert(m_options.berdyVariant == BERDY_FLOATING_BASE);
            // We have to map the joint wrench to the joint torques, since joint wrench is considered as dynamic variable
            for (TraversalIndex traversalEl = 1;
                traversalEl < static_cast<TraversalIndex>(m_dynamicsTraversal.getNrOfVisitedLinks());
                traversalEl++)
            {
                LinkConstPtr visitedLink = m_dynamicsTraversal.getLink(traversalEl);
                LinkConstPtr parentLink = m_dynamicsTraversal.getParentLink(traversalEl);
                IJointConstPtr toParentJoint = m_dynamicsTraversal.getParentJoint(traversalEl);
                LinkIndex visitedLinkIdx = visitedLink->getIndex();
                LinkIndex parentLinkIdx = parentLink->getIndex();
            
                size_t jointDOFs = toParentJoint->getNrOfDOFs();
                size_t dofOffset = toParentJoint->getDOFsOffset();
            
                for (size_t localDof = 0; localDof < jointDOFs; localDof++)
                {
                    SpatialMotionVector S = toParentJoint->getMotionSubspaceVector(localDof, visitedLinkIdx, parentLinkIdx);
                    Matrix1x6 SdynTree;
                    toEigen(SdynTree) = toEigen(S).transpose();
              
                    matrixYElements.addSubMatrix(getRangeDOFSensorVariable(DOF_TORQUE_SENSOR, dofOffset + localDof).offset,
                                                 getRangeJointVariable(JOINT_WRENCH, toParentJoint->getIndex()).offset,
                                                 SdynTree);
                }
            }
        }
    }

    ////////////////////////////////////////////////////////////////////////
    ///// NET EXTERNAL WRENCHES ACTING ON LINKS
    ////////////////////////////////////////////////////////////////////////
    if( m_options.includeAllNetExternalWrenchesAsSensors )
    {
        for(LinkIndex idx = 0; idx < static_cast<LinkIndex>(m_model.getNrOfLinks()); idx++)
        {
            // If this link is the (fixed) base link and the
            // berdy variant is ORIGINAL_BERDY_FIXED_BASE , then
            // the net wrench applied on the base is not part of the dynamical
            // system. Anyhow, we can still write the base wrench as a function
            // of sum of the joint wrenches of all the joints attached to the base (tipically just one)
            if( m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE &&
                m_dynamicsTraversal.getBaseLink()->getIndex() == idx )
            {
                if(  m_options.includeFixedBaseExternalWrench  )
                {
                    // Y encodes the (time varyng) relation between the wrenches transmitted by the joint attached
                    // to the base and net external wrench applied on the robot
                    // \todo TODO this "get child" for is duplicated in the code, we
                    // should try to consolidate it
                    for(unsigned int neigh_i=0; neigh_i < m_model.getNrOfNeighbors(idx); neigh_i++)
                    {
                        LinkIndex neighborIndex = m_model.getNeighbor(idx,neigh_i).neighborLink;
                        LinkIndex childIndex = neighborIndex;
                        IJointConstPtr neighborJoint = m_model.getJoint(m_model.getNeighbor(idx,neigh_i).neighborJoint);
                        const Transform & base_X_child = neighborJoint->getTransform(m_jointPos,idx,childIndex);
                        Transform measurementFrame_X_child = m_link_H_externalWrenchMeasurementFrame[idx].inverse()*base_X_child;

                        matrixYElements.addSubMatrix(getRangeLinkSensorVariable(NET_EXT_WRENCH_SENSOR,idx).offset,
                                                     getRangeJointVariable(JOINT_WRENCH,neighborJoint->getIndex()).offset, measurementFrame_X_child.asAdjointTransformWrench());
                    }

                    // bY encodes the weight of the base link due to gravity (we omit the v*I*v as it is always zero)
                    Wrench baseLinkNetTotalWrenchesWithoutGrav = -(m_model.getLink(idx)->getInertia()*m_gravity6D);
                    setSubVector(bY,getRangeLinkSensorVariable(NET_EXT_WRENCH_SENSOR,idx),toEigen(baseLinkNetTotalWrenchesWithoutGrav));
                }
            }
            else
            {
                // Y for the net external wrenches is just
                // six rows of 0 with an identity placed at the location
                // of the net external wrenches in the dynamic variable vector
                IndexRange sensorRange = this->getRangeLinkSensorVariable(NET_EXT_WRENCH_SENSOR,idx);
                IndexRange netExtWrenchRange = this->getRangeLinkVariable(NET_EXT_WRENCH,idx);

                Transform measurementFrame_X_link = m_link_H_externalWrenchMeasurementFrame[idx].inverse();

                matrixYElements.addSubMatrix(sensorRange.offset,
                                             netExtWrenchRange.offset,
                                             measurementFrame_X_link.asAdjointTransformWrench());

                // bY for the net external wrenches is zero
            }
        }
    }

    ////////////////////////////////////////////////////////////////////////
    ///// JOINT WRENCHES
    ////////////////////////////////////////////////////////////////////////
    for(size_t i = 0; i < this->berdySensorsInfo.wrenchSensors.size(); i++)
    {
        // Y for the joint wrenches is just
        // six rows of 0 with an identity placed at the location
        // of the joint wrenches in the dynamic variable vector
        IndexRange sensorRange = this->getRangeJointSensorVariable(JOINT_WRENCH_SENSOR,berdySensorsInfo.wrenchSensors[i]);
        IndexRange jointWrenchOffset = this->getRangeJointVariable(JOINT_WRENCH,berdySensorsInfo.wrenchSensors[i]);

        assert(sensorRange.size == 6);
        assert(jointWrenchOffset.size == 6);
        matrixYElements.addDiagonalMatrix(sensorRange,
                                          jointWrenchOffset,
                                          1);

        // bY for the joint wrenches is zero
    }

    ////////////////////////////////////////////////////////////////////////
    ///// Rate of Change of Momentum (RCM) SENSOR
    ////////////////////////////////////////////////////////////////////////
    if (m_options.berdyVariant==BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES)
    {
        // Get the row index corresponding to the RCM sensor
        IndexRange rcmRange = this->getRangeRCMSensorVariable(RCM_SENSOR);

        for(LinkIndex idx = 0 ; idx < m_model.getNrOfLinks(); idx++)
        {
            // Get the column index corresponding to the net link external wrench sensor
            IndexRange netExternalWrenchVariableIndexRange = this->getRangeLinkVariable(NET_EXT_WRENCH, idx);

            // Get base to link transform
            Transform base_X_link = base_H_links(idx);

            // Get link to base rotation
            matrixYElements.addSubMatrix(rcmRange.offset,
                                         netExternalWrenchVariableIndexRange.offset,
                                         base_X_link.asAdjointTransformWrench());
        }

        // bY for the RCM sensor is zero
    }

    Y.setFromTriplets(matrixYElements);
    return true;
}